

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordingReporter.h
# Opt level: O0

void __thiscall RecordingReporter::RecordingReporter(RecordingReporter *this)

{
  RecordingReporter *this_local;
  
  UnitTest::TestReporter::TestReporter(&this->super_TestReporter);
  (this->super_TestReporter)._vptr_TestReporter = (_func_int **)&PTR__RecordingReporter_00183810;
  this->testRunCount = 0;
  this->testFailedCount = 0;
  this->lastFailedLine = 0;
  this->testFinishedCount = 0;
  this->lastFinishedTestTime = 0.0;
  this->summaryTotalTestCount = 0;
  this->summaryFailedTestCount = 0;
  this->summaryFailureCount = 0;
  this->summarySecondsElapsed = 0.0;
  this->lastStartedSuite[0] = '\0';
  this->lastStartedTest[0] = '\0';
  this->lastFailedFile[0] = '\0';
  this->lastFailedSuite[0] = '\0';
  this->lastFailedTest[0] = '\0';
  this->lastFailedMessage[0] = '\0';
  this->lastFinishedSuite[0] = '\0';
  this->lastFinishedTest[0] = '\0';
  return;
}

Assistant:

RecordingReporter()
        : testRunCount(0)
        , testFailedCount(0)
        , lastFailedLine(0)
        , testFinishedCount(0)
        , lastFinishedTestTime(0)
        , summaryTotalTestCount(0)
        , summaryFailedTestCount(0)
        , summaryFailureCount(0)
        , summarySecondsElapsed(0)
    {
        lastStartedSuite[0] = '\0';
        lastStartedTest[0] = '\0';
        lastFailedFile[0] = '\0';
        lastFailedSuite[0] = '\0';
        lastFailedTest[0] = '\0';
        lastFailedMessage[0] = '\0';
        lastFinishedSuite[0] = '\0';
        lastFinishedTest[0] = '\0';
    }